

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::RepeatedField<int>::Reserve(RepeatedField<int> *this,int new_size)

{
  int *__src;
  uint uVar1;
  int *__dest;
  ulong uVar2;
  
  if (this->total_size_ < new_size) {
    __src = this->elements_;
    uVar1 = this->total_size_ * 2;
    if ((int)uVar1 <= new_size) {
      uVar1 = new_size;
    }
    uVar2 = 4;
    if (4 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    this->total_size_ = (int)uVar2;
    __dest = (int *)operator_new__(uVar2 << 2);
    this->elements_ = __dest;
    if (__src != (int *)0x0) {
      memcpy(__dest,__src,(long)this->current_size_ << 2);
      operator_delete__(__src);
      return;
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;

  Element* old_elements = elements_;
  total_size_ = max(google::protobuf::internal::kMinRepeatedFieldAllocationSize,
                    max(total_size_ * 2, new_size));
  elements_ = new Element[total_size_];
  if (old_elements != NULL) {
    MoveArray(elements_, old_elements, current_size_);
    delete [] old_elements;
  }
}